

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O0

Gia_Man_t * Nf_ManPerformMapping(Gia_Man_t *pGia,Jf_Par_t *pPars)

{
  int iVar1;
  Nf_Man_t *p_00;
  Gia_Obj_t *pGVar2;
  word wVar3;
  Gia_Man_t *pGVar4;
  char *pTitle;
  bool bVar5;
  float fVar6;
  Gia_Man_t *local_40;
  int local_38;
  int local_34;
  int Id;
  int i;
  Nf_Man_t *p;
  Gia_Man_t *pCls;
  Gia_Man_t *pNew;
  Jf_Par_t *pPars_local;
  Gia_Man_t *pGia_local;
  
  iVar1 = Gia_ManHasChoices(pGia);
  if (iVar1 != 0) {
    pPars->fCoarsen = 0;
  }
  local_40 = pGia;
  if (pPars->fCoarsen != 0) {
    local_40 = Gia_ManDupMuxes(pGia,pPars->nCoarseLimit);
  }
  p_00 = Nf_StoCreate(local_40,pPars);
  if ((pPars->fVerbose != 0) && (pPars->fCoarsen != 0)) {
    printf("Initial ");
    Gia_ManPrintMuxStats(pGia);
    printf("\n");
    printf("Derived ");
    Gia_ManPrintMuxStats(local_40);
    printf("\n");
  }
  Nf_ManPrintInit(p_00);
  Nf_ManComputeCuts(p_00);
  Nf_ManPrintQuit(p_00);
  iVar1 = Scl_ConIsRunning();
  if (iVar1 == 0) {
    local_34 = 0;
    while( true ) {
      iVar1 = Vec_IntSize(p_00->pGia->vCis);
      bVar5 = false;
      if (local_34 < iVar1) {
        pGVar4 = p_00->pGia;
        pGVar2 = Gia_ManCi(p_00->pGia,local_34);
        local_38 = Gia_ObjId(pGVar4,pGVar2);
        bVar5 = local_38 != 0;
      }
      if (!bVar5) break;
      if (p_00->pGia->vInArrs == (Vec_Flt_t *)0x0) {
        fVar6 = 0.0;
      }
      else {
        fVar6 = Vec_FltEntry(p_00->pGia->vInArrs,local_34);
        fVar6 = Abc_MaxFloat(0.0,fVar6);
      }
      wVar3 = Nf_Flt2Wrd(fVar6);
      Nf_ObjPrepareCi(p_00,local_38,wVar3);
      local_34 = local_34 + 1;
    }
  }
  else {
    local_34 = 0;
    while( true ) {
      iVar1 = Vec_IntSize(p_00->pGia->vCis);
      bVar5 = false;
      if (local_34 < iVar1) {
        pGVar4 = p_00->pGia;
        pGVar2 = Gia_ManCi(p_00->pGia,local_34);
        local_38 = Gia_ObjId(pGVar4,pGVar2);
        bVar5 = local_38 != 0;
      }
      if (!bVar5) break;
      wVar3 = Scl_ConGetInArr(local_34);
      Nf_ObjPrepareCi(p_00,local_38,wVar3);
      local_34 = local_34 + 1;
    }
  }
  p_00->Iter = 0;
  while (p_00->Iter < p_00->pPars->nRounds) {
    Nf_ManComputeMapping(p_00);
    Nf_ManSetMapRefs(p_00);
    pTitle = "Delay";
    if (p_00->Iter != 0) {
      pTitle = "Area ";
    }
    Nf_ManPrintStats(p_00,pTitle);
    p_00->Iter = p_00->Iter + 1;
  }
  p_00->fUseEla = 1;
  while (p_00->Iter < p_00->pPars->nRounds + pPars->nRoundsEla) {
    Nf_ManComputeMappingEla(p_00);
    Nf_ManUpdateStats(p_00);
    Nf_ManPrintStats(p_00,"Ela  ");
    p_00->Iter = p_00->Iter + 1;
  }
  pGVar4 = Nf_ManDeriveMapping(p_00);
  Nf_StoDelete(p_00);
  return pGVar4;
}

Assistant:

Gia_Man_t * Nf_ManPerformMapping( Gia_Man_t * pGia, Jf_Par_t * pPars )
{
    Gia_Man_t * pNew = NULL, * pCls;
    Nf_Man_t * p; int i, Id;
    if ( Gia_ManHasChoices(pGia) )
        pPars->fCoarsen = 0; 
    pCls = pPars->fCoarsen ? Gia_ManDupMuxes(pGia, pPars->nCoarseLimit) : pGia;
    p = Nf_StoCreate( pCls, pPars );
//    if ( pPars->fVeryVerbose )
//        Nf_StoPrint( p, pPars->fVeryVerbose );
    if ( pPars->fVerbose && pPars->fCoarsen )
    {
        printf( "Initial " );  Gia_ManPrintMuxStats( pGia );  printf( "\n" );
        printf( "Derived " );  Gia_ManPrintMuxStats( pCls );  printf( "\n" );
    }
    Nf_ManPrintInit( p );
    Nf_ManComputeCuts( p );
    Nf_ManPrintQuit( p );
    if ( Scl_ConIsRunning() )
    {
        Gia_ManForEachCiId( p->pGia, Id, i )
            Nf_ObjPrepareCi( p, Id, Scl_ConGetInArr(i) );
    }
    else
    {
        Gia_ManForEachCiId( p->pGia, Id, i )
            Nf_ObjPrepareCi( p, Id, Nf_Flt2Wrd(p->pGia->vInArrs ? Abc_MaxFloat(0.0, Vec_FltEntry(p->pGia->vInArrs, i)) : 0.0) );
    }
    for ( p->Iter = 0; p->Iter < p->pPars->nRounds; p->Iter++ )
    {
        Nf_ManComputeMapping( p );
        Nf_ManSetMapRefs( p );
        Nf_ManPrintStats( p, (char *)(p->Iter ? "Area " : "Delay") );
    }

    p->fUseEla = 1;
    for ( ; p->Iter < p->pPars->nRounds + pPars->nRoundsEla; p->Iter++ )
    {
        Nf_ManComputeMappingEla( p );
        Nf_ManUpdateStats( p );
        Nf_ManPrintStats( p, "Ela  " );
    }
    pNew = Nf_ManDeriveMapping( p );
    Nf_StoDelete( p );
    return pNew;
}